

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynBlock * ParseBlock(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  undefined4 extraout_var;
  IntrusiveList<SynBase> IVar2;
  SynBlock *this;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_ofigure) {
    ctx->currentLexeme = begin + 1;
    if (0xff < ctx->statementBlockDepth) {
      anon_unknown.dwarf_169315::Stop(ctx,begin + 1,"ERROR: reached nested \'{\' limit of %d",0x100)
      ;
    }
    ctx->statementBlockDepth = ctx->statementBlockDepth + 1;
    IVar2 = ParseExpressions(ctx);
    ctx->statementBlockDepth = ctx->statementBlockDepth - 1;
    anon_unknown.dwarf_169315::CheckConsume(ctx,lex_cfigure,"ERROR: closing \'}\' not found");
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    this = (SynBlock *)CONCAT44(extraout_var,iVar1);
    if (ctx->currentLexeme <= ctx->firstLexeme) {
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
    SynBase::SynBase((SynBase *)this,0x26,begin,ctx->currentLexeme + -1);
    (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e7e30;
    this->expressions = IVar2;
  }
  else {
    this = (SynBlock *)0x0;
  }
  return this;
}

Assistant:

SynBlock* ParseBlock(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_ofigure))
	{
		const unsigned blockLimit = 256;

		if(ctx.statementBlockDepth >= blockLimit)
			Stop(ctx, ctx.Current(), "ERROR: reached nested '{' limit of %d", blockLimit);

		ctx.statementBlockDepth++;

		IntrusiveList<SynBase> expressions = ParseExpressions(ctx);

		ctx.statementBlockDepth--;

		CheckConsume(ctx, lex_cfigure, "ERROR: closing '}' not found");

		return new (ctx.get<SynBlock>()) SynBlock(start, ctx.Previous(), expressions);
	}

	return NULL;
}